

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsEqualPrecision1_Test::~Equality_unitsEqualPrecision1_Test
          (Equality_unitsEqualPrecision1_Test *this)

{
  Equality_unitsEqualPrecision1_Test *this_local;
  
  ~Equality_unitsEqualPrecision1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsEqualPrecision1)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 1.0);
    u2->addUnit("second", 1.0 + std::numeric_limits<double>::epsilon());

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}